

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_visitor.hpp
# Opt level: O3

LogicalType * __thiscall
duckdb::TypeVisitor::VisitReplace<duckdb::ParquetWriteSelect(duckdb::CopyToSelectInput&)::__0&>
          (LogicalType *__return_storage_ptr__,TypeVisitor *this,LogicalType *type,
          anon_class_1_0_00000001 *func)

{
  TypeVisitor TVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  *__x;
  LogicalType *extraout_RAX;
  LogicalType *pLVar3;
  idx_t index;
  LogicalType *extraout_RAX_00;
  LogicalType *extraout_RAX_01;
  LogicalType *extraout_RAX_02;
  uint uVar4;
  anon_class_1_0_00000001 *func_00;
  LogicalType *extraout_RDX;
  LogicalType *extraout_RDX_00;
  LogicalType *type_00;
  LogicalType *type_01;
  LogicalType *type_02;
  LogicalType *extraout_RDX_01;
  LogicalType *extraout_RDX_02;
  LogicalType *type_03;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  *this_00;
  TypeVisitor *pTVar5;
  element_type *peVar6;
  LogicalType value;
  child_list_t<LogicalType> children;
  LogicalType local_d0;
  LogicalType local_b8;
  LogicalType local_a0;
  optional_idx local_88;
  LogicalType local_80;
  LogicalType local_68;
  child_list_t<LogicalType> local_50;
  child_list_t<LogicalType> local_38;
  
  TVar1 = *this;
  uVar4 = (byte)TVar1 - 100;
  if (8 < uVar4) {
switchD_01b40e7d_caseD_67:
    if (1 < (byte)((char)TVar1 - 0x31U)) {
      LogicalType::LogicalType(__return_storage_ptr__,(LogicalType *)this);
      return extraout_RAX_00;
    }
    LogicalType::LogicalType(__return_storage_ptr__,VARCHAR);
    return extraout_RAX;
  }
  func_00 = (anon_class_1_0_00000001 *)
            ((long)&switchD_01b40e7d::switchdataD_01e20f5c +
            (long)(int)(&switchD_01b40e7d::switchdataD_01e20f5c)[uVar4]);
  switch((uint)(byte)TVar1) {
  case 100:
    __x = &StructType::GetChildTypes_abi_cxx11_((LogicalType *)this)->
           super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ;
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              *)&local_b8,__x);
    if ((element_type *)local_b8._0_8_ !=
        local_b8.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
      pLVar3 = extraout_RDX;
      pTVar5 = (TypeVisitor *)
               ((long)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(local_b8._0_8_ + 0x10))->_M_local_buf + 0x10);
      do {
        VisitReplace<duckdb::ParquetWriteSelect(duckdb::CopyToSelectInput&)::__0&>
                  (&local_d0,pTVar5,pLVar3,func_00);
        *pTVar5 = (TypeVisitor)local_d0.id_;
        pTVar5[1] = (TypeVisitor)local_d0.physical_type_;
        peVar6 = *(element_type **)(pTVar5 + 8);
        p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pTVar5 + 0x10);
        *(element_type **)(pTVar5 + 8) =
             local_d0.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pTVar5 + 0x10) =
             local_d0.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        ;
        local_d0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar6;
        local_d0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             p_Var2;
        LogicalType::~LogicalType(&local_d0);
        peVar6 = (element_type *)(pTVar5 + 0x18);
        pLVar3 = extraout_RDX_00;
        pTVar5 = pTVar5 + 0x38;
      } while (peVar6 != local_b8.type_info_.internal.
                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
    }
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              *)&local_38,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              *)&local_b8);
    LogicalType::STRUCT(&local_d0,&local_38);
    if ((byte)(local_d0.id_ - 0x31) < 2) {
      LogicalType::LogicalType(__return_storage_ptr__,VARCHAR);
    }
    else {
      LogicalType::LogicalType(__return_storage_ptr__,&local_d0);
    }
    LogicalType::~LogicalType(&local_d0);
    this_00 = (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               *)&local_38;
    goto LAB_01b41205;
  case 0x65:
    pLVar3 = ListType::GetChildType((LogicalType *)this);
    LogicalType::LogicalType(&local_b8,pLVar3);
    VisitReplace<duckdb::ParquetWriteSelect(duckdb::CopyToSelectInput&)::__0&>
              (&local_a0,(TypeVisitor *)&local_b8,type_02,func_00);
    LogicalType::LIST(&local_d0,&local_a0);
    if ((byte)(local_d0.id_ - 0x31) < 2) {
      LogicalType::LogicalType(__return_storage_ptr__,VARCHAR);
    }
    else {
      LogicalType::LogicalType(__return_storage_ptr__,&local_d0);
    }
    break;
  case 0x66:
    pLVar3 = MapType::KeyType((LogicalType *)this);
    LogicalType::LogicalType(&local_b8,pLVar3);
    pLVar3 = MapType::ValueType((LogicalType *)this);
    LogicalType::LogicalType(&local_d0,pLVar3);
    VisitReplace<duckdb::ParquetWriteSelect(duckdb::CopyToSelectInput&)::__0&>
              (&local_68,(TypeVisitor *)&local_b8,type_00,func_00);
    VisitReplace<duckdb::ParquetWriteSelect(duckdb::CopyToSelectInput&)::__0&>
              (&local_80,(TypeVisitor *)&local_d0,type_01,func_00);
    LogicalType::MAP(&local_a0,&local_68,&local_80);
    if ((byte)(local_a0.id_ - UHUGEINT) < 2) {
      LogicalType::LogicalType(__return_storage_ptr__,VARCHAR);
    }
    else {
      LogicalType::LogicalType(__return_storage_ptr__,&local_a0);
    }
    LogicalType::~LogicalType(&local_a0);
    LogicalType::~LogicalType(&local_80);
    LogicalType::~LogicalType(&local_68);
    pLVar3 = &local_d0;
    goto LAB_01b411b4;
  default:
    goto switchD_01b40e7d_caseD_67;
  case 0x6b:
    UnionType::CopyMemberTypes_abi_cxx11_
              ((child_list_t<LogicalType> *)&local_b8,(UnionType *)this,
               (LogicalType *)&switchD_01b40e7d::switchdataD_01e20f5c);
    if ((element_type *)local_b8._0_8_ !=
        local_b8.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
      pLVar3 = extraout_RDX_01;
      pTVar5 = (TypeVisitor *)
               ((long)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(local_b8._0_8_ + 0x10))->_M_local_buf + 0x10);
      do {
        VisitReplace<duckdb::ParquetWriteSelect(duckdb::CopyToSelectInput&)::__0&>
                  (&local_d0,pTVar5,pLVar3,func_00);
        *pTVar5 = (TypeVisitor)local_d0.id_;
        pTVar5[1] = (TypeVisitor)local_d0.physical_type_;
        peVar6 = *(element_type **)(pTVar5 + 8);
        p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pTVar5 + 0x10);
        *(element_type **)(pTVar5 + 8) =
             local_d0.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pTVar5 + 0x10) =
             local_d0.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        ;
        local_d0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar6;
        local_d0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             p_Var2;
        LogicalType::~LogicalType(&local_d0);
        peVar6 = (element_type *)(pTVar5 + 0x18);
        pLVar3 = extraout_RDX_02;
        pTVar5 = pTVar5 + 0x38;
      } while (peVar6 != local_b8.type_info_.internal.
                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
    }
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              *)&local_50,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              *)&local_b8);
    LogicalType::UNION(&local_d0,&local_50);
    if ((byte)(local_d0.id_ - 0x31) < 2) {
      LogicalType::LogicalType(__return_storage_ptr__,VARCHAR);
    }
    else {
      LogicalType::LogicalType(__return_storage_ptr__,&local_d0);
    }
    LogicalType::~LogicalType(&local_d0);
    this_00 = (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               *)&local_50;
LAB_01b41205:
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::~vector(this_00);
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               *)&local_b8);
    return extraout_RAX_02;
  case 0x6c:
    pLVar3 = ArrayType::GetChildType((LogicalType *)this);
    LogicalType::LogicalType(&local_b8,pLVar3);
    VisitReplace<duckdb::ParquetWriteSelect(duckdb::CopyToSelectInput&)::__0&>
              (&local_a0,(TypeVisitor *)&local_b8,type_03,func_00);
    index = ArrayType::GetSize((LogicalType *)this);
    optional_idx::optional_idx(&local_88,index);
    LogicalType::ARRAY(&local_d0,&local_a0,local_88);
    if ((byte)(local_d0.id_ - 0x31) < 2) {
      LogicalType::LogicalType(__return_storage_ptr__,VARCHAR);
    }
    else {
      LogicalType::LogicalType(__return_storage_ptr__,&local_d0);
    }
  }
  LogicalType::~LogicalType(&local_d0);
  pLVar3 = &local_a0;
LAB_01b411b4:
  LogicalType::~LogicalType(pLVar3);
  LogicalType::~LogicalType(&local_b8);
  return extraout_RAX_01;
}

Assistant:

inline LogicalType TypeVisitor::VisitReplace(const LogicalType &type, F &&func) {
	switch (type.id()) {
	case LogicalTypeId::STRUCT: {
		auto children = StructType::GetChildTypes(type);
		for (auto &child : children) {
			child.second = VisitReplace(child.second, func);
		}
		return func(LogicalType::STRUCT(children));
	}
	case LogicalTypeId::UNION: {
		auto children = UnionType::CopyMemberTypes(type);
		for (auto &child : children) {
			child.second = VisitReplace(child.second, func);
		}
		return func(LogicalType::UNION(children));
	}
	case LogicalTypeId::LIST: {
		auto child = ListType::GetChildType(type);
		return func(LogicalType::LIST(VisitReplace(child, func)));
	}
	case LogicalTypeId::ARRAY: {
		auto child = ArrayType::GetChildType(type);
		return func(LogicalType::ARRAY(VisitReplace(child, func), ArrayType::GetSize(type)));
	}
	case LogicalTypeId::MAP: {
		auto key = MapType::KeyType(type);
		auto value = MapType::ValueType(type);
		return func(LogicalType::MAP(VisitReplace(key, func), VisitReplace(value, func)));
	}
	default:
		return func(type);
	}
}